

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_settings.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::session_settings_single_thread::session_settings_single_thread
          (session_settings_single_thread *this)

{
  long lVar1;
  
  lVar1 = 0x10;
  do {
    *(long *)((long)(this->m_strings)._M_elems + lVar1 + -0x10) =
         (long)&(this->m_strings)._M_elems[0]._M_dataplus._M_p + lVar1;
    *(undefined8 *)((long)(this->m_strings)._M_elems + lVar1 + -8) = 0;
    *(undefined1 *)((long)&(this->m_strings)._M_elems[0]._M_dataplus._M_p + lVar1) = 0;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0x1b0);
  (this->m_bools).super__Base_bitset<2UL>._M_w[0] = 0;
  (this->m_bools).super__Base_bitset<2UL>._M_w[1] = 0;
  initialize_default_settings(this);
  return;
}

Assistant:

session_settings_single_thread::session_settings_single_thread()
	{
		initialize_default_settings(*this);
	}